

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilderPrivate * __thiscall QMetaMethodBuilder::d_func(QMetaMethodBuilder *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *in_RDI;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *this_00;
  
  this_00 = in_RDI;
  if ((((in_RDI->
        super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>).
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
      (-1 < *(int *)&(in_RDI->
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     )._M_impl.super__Vector_impl_data._M_finish)) &&
     (iVar1 = *(int *)&(in_RDI->
                       super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
     sVar2 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
             size((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
                  ((((in_RDI->
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     )._M_impl.super__Vector_impl_data._M_start)->signature).d.ptr + 0x28)),
     iVar1 < (int)sVar2)) {
    pvVar3 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
             operator[](this_00,(size_type)in_RDI);
    return pvVar3;
  }
  if ((((in_RDI->
        super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>).
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
      (*(int *)&(in_RDI->
                super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                )._M_impl.super__Vector_impl_data._M_finish < 0)) &&
     (iVar1 = *(int *)&(in_RDI->
                       super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
     sVar2 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
             size((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
                  ((((in_RDI->
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     )._M_impl.super__Vector_impl_data._M_start)->signature).d.ptr + 0x40)),
     -iVar1 <= (int)sVar2)) {
    pvVar3 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
             operator[](this_00,(size_type)in_RDI);
    return pvVar3;
  }
  return (QMetaMethodBuilderPrivate *)0x0;
}

Assistant:

QMetaMethodBuilderPrivate *QMetaMethodBuilder::d_func() const
{
    // Positive indices indicate methods, negative indices indicate constructors.
    if (_mobj && _index >= 0 && _index < int(_mobj->d->methods.size()))
        return &(_mobj->d->methods[_index]);
    else if (_mobj && -_index >= 1 && -_index <= int(_mobj->d->constructors.size()))
        return &(_mobj->d->constructors[(-_index) - 1]);
    else
        return nullptr;
}